

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Tree::has_sibling(Tree *this,size_t node,size_t sib)

{
  size_t sVar1;
  NodeData *pNVar2;
  size_t in_stack_00000028;
  Tree *in_stack_00000030;
  
  pNVar2 = _p(in_stack_00000030,in_stack_00000028);
  sVar1 = pNVar2->m_parent;
  pNVar2 = _p(in_stack_00000030,in_stack_00000028);
  return sVar1 == pNVar2->m_parent;
}

Assistant:

bool has_sibling(size_t node, size_t sib) const { return _p(node)->m_parent == _p(sib)->m_parent; }